

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbiw__outfile(stbi__write_context *s,int rgb_dir,int vdir,int x,int y,int comp,int expand_mono,
                  void *data,int alpha,int pad,char *fmt,...)

{
  char in_AL;
  int iVar1;
  ulong uVar2;
  int iVar3;
  undefined4 uVar4;
  void *pvVar5;
  bool bVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list v;
  void *local_140;
  undefined4 local_134;
  ulong local_130;
  uchar *local_128;
  long local_120;
  long local_118;
  ulong local_110;
  __va_list_tag local_108;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  uVar4 = (undefined4)((ulong)_comp >> 0x20);
  iVar1 = (int)_comp;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((y | x) < 0) {
    iVar1 = 0;
  }
  else {
    local_108.reg_save_area = local_e8;
    local_108.overflow_arg_area = &stack0x00000030;
    local_108.gp_offset = 0x30;
    local_108.fp_offset = 0x30;
    iVar3 = iVar1;
    stbiw__writefv(s,fmt,&local_108);
    local_134 = 0;
    if (0 < y) {
      local_110 = 0;
      if (stbi__flip_vertically_on_write == 0) {
        local_110 = (ulong)(y - 1);
      }
      bVar6 = stbi__flip_vertically_on_write == 0;
      local_128 = s->buffer;
      local_118 = (ulong)(stbi__flip_vertically_on_write != 0) * 2 + -1;
      local_130 = (ulong)(uint)x;
      local_120 = (long)x * (long)iVar1;
      local_140 = (void *)(local_120 * local_110 + (long)data);
      local_120 = local_120 * local_118;
      do {
        uVar2 = local_130;
        pvVar5 = local_140;
        if (0 < x) {
          do {
            stbiw__write_pixel(s,iVar1,alpha,expand_mono,(int)pvVar5,(uchar *)CONCAT44(uVar4,iVar3))
            ;
            uVar2 = uVar2 - 1;
            pvVar5 = (void *)((long)pvVar5 + (long)iVar1);
          } while (uVar2 != 0);
        }
        uVar2 = local_110;
        if (s->buf_used != 0) {
          (*s->func)(s->context,local_128,s->buf_used);
          s->buf_used = 0;
        }
        (*s->func)(s->context,&local_134,pad);
        local_110 = uVar2 + local_118;
        local_140 = (void *)((long)local_140 + local_120);
      } while ((-(uint)bVar6 | y) != (uint)local_110);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int stbiw__outfile(stbi__write_context *s, int rgb_dir, int vdir, int x, int y, int comp, int expand_mono, void *data, int alpha, int pad, const char *fmt, ...)
{
   if (y < 0 || x < 0) {
      return 0;
   } else {
      va_list v;
      va_start(v, fmt);
      stbiw__writefv(s, fmt, v);
      va_end(v);
      stbiw__write_pixels(s,rgb_dir,vdir,x,y,comp,data,alpha,pad, expand_mono);
      return 1;
   }
}